

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::Base64Test_test_encode_decode_gives_original_value_Test::
Base64Test_test_encode_decode_gives_original_value_Test
          (Base64Test_test_encode_decode_gives_original_value_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_002776d8;
  return;
}

Assistant:

TEST(Base64Test, test_encode_decode_gives_original_value)
{
    EXPECT_EQ("chicken", Base64Decode(Base64Encode("chicken", 7)));
    EXPECT_EQ("123", Base64Decode(Base64Encode("123", 3)));
    EXPECT_EQ("hello", Base64Decode(Base64Encode("hello", 5)));
    EXPECT_EQ("-_-", Base64Decode(Base64Encode("-_-", 3)));
    EXPECT_EQ("   ", Base64Decode(Base64Encode("   ", 3)));
    EXPECT_EQ("", Base64Decode(Base64Encode("", 0)));
}